

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O0

void ihevcd_fmt_conv_420sp_to_420p
               (UWORD8 *pu1_y_src,UWORD8 *pu1_uv_src,UWORD8 *pu1_y_dst,UWORD8 *pu1_u_dst,
               UWORD8 *pu1_v_dst,WORD32 wd,WORD32 ht,WORD32 src_y_strd,WORD32 src_uv_strd,
               WORD32 dst_y_strd,WORD32 dst_uv_strd,WORD32 is_u_first,WORD32 disable_luma_copy)

{
  long in_RCX;
  void *in_RDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  int in_R9D;
  WORD32 j;
  WORD32 i;
  WORD32 dst_strd;
  WORD32 src_strd;
  WORD32 num_cols;
  WORD32 num_rows;
  UWORD8 *pu1_v_src;
  UWORD8 *pu1_u_src;
  UWORD8 *pu1_dst;
  UWORD8 *pu1_src;
  int in_stack_00000038;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_20;
  
  if (in_stack_00000038 == 0) {
    local_40 = in_RDX;
    local_38 = in_RDI;
    for (local_64 = 0; local_64 < dst_strd; local_64 = local_64 + 1) {
      memcpy(local_40,local_38,(long)in_R9D);
      local_40 = (void *)((long)local_40 + (long)(int)pu1_u_src);
      local_38 = (void *)((long)local_38 + (long)num_cols);
    }
  }
  if ((int)pu1_src == 0) {
    local_48 = in_RSI + 1;
    local_50 = in_RSI;
  }
  else {
    local_50 = in_RSI + 1;
    local_48 = in_RSI;
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  for (local_64 = 0; local_64 < dst_strd >> 1; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < in_R9D >> 1; local_68 = local_68 + 1) {
      *(undefined1 *)(local_20 + local_68) = *(undefined1 *)(local_48 + (local_68 << 1));
      *(undefined1 *)(local_28 + local_68) = *(undefined1 *)(local_50 + (local_68 << 1));
    }
    local_20 = local_20 + (int)pu1_dst;
    local_28 = local_28 + (int)pu1_dst;
    local_48 = local_48 + (int)pu1_v_src;
    local_50 = local_50 + (int)pu1_v_src;
  }
  return;
}

Assistant:

void ihevcd_fmt_conv_420sp_to_420p(UWORD8 *pu1_y_src,
                                   UWORD8 *pu1_uv_src,
                                   UWORD8 *pu1_y_dst,
                                   UWORD8 *pu1_u_dst,
                                   UWORD8 *pu1_v_dst,
                                   WORD32 wd,
                                   WORD32 ht,
                                   WORD32 src_y_strd,
                                   WORD32 src_uv_strd,
                                   WORD32 dst_y_strd,
                                   WORD32 dst_uv_strd,
                                   WORD32 is_u_first,
                                   WORD32 disable_luma_copy)
{
    UWORD8 *pu1_src, *pu1_dst;
    UWORD8 *pu1_u_src, *pu1_v_src;
    WORD32 num_rows, num_cols, src_strd, dst_strd;
    WORD32 i, j;

    if(0 == disable_luma_copy)
    {
        /* copy luma */
        pu1_src = (UWORD8 *)pu1_y_src;
        pu1_dst = (UWORD8 *)pu1_y_dst;

        num_rows = ht;
        num_cols = wd;

        src_strd = src_y_strd;
        dst_strd = dst_y_strd;

        for(i = 0; i < num_rows; i++)
        {
            memcpy(pu1_dst, pu1_src, num_cols);
            pu1_dst += dst_strd;
            pu1_src += src_strd;
        }
    }
    /* de-interleave U and V and copy to destination */
    if(is_u_first)
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src;
        pu1_v_src = (UWORD8 *)pu1_uv_src + 1;
    }
    else
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src + 1;
        pu1_v_src = (UWORD8 *)pu1_uv_src;
    }


    num_rows = ht >> 1;
    num_cols = wd >> 1;

    src_strd = src_uv_strd;
    dst_strd = dst_uv_strd;

    for(i = 0; i < num_rows; i++)
    {
        for(j = 0; j < num_cols; j++)
        {
            pu1_u_dst[j] = pu1_u_src[j * 2];
            pu1_v_dst[j] = pu1_v_src[j * 2];
        }

        pu1_u_dst += dst_strd;
        pu1_v_dst += dst_strd;
        pu1_u_src += src_strd;
        pu1_v_src += src_strd;
    }
    return;
}